

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,REF_GRID ref_grid)

{
  double *pdVar1;
  REF_NODE pRVar2;
  REF_MPI ref_mpi;
  uint uVar3;
  REF_DBL *scalar;
  REF_DBL *pRVar4;
  ulong uVar5;
  ulong uVar6;
  undefined8 uVar7;
  REF_STATUS RVar8;
  char *pcVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  REF_DBL __x;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  REF_DBL max_threshold;
  void *local_d0;
  REF_DBL *local_c8;
  REF_DBL *local_c0;
  double local_b8;
  REF_MPI local_b0;
  double local_a8;
  REF_DBL temp;
  REF_DBL diag [12];
  
  pRVar2 = ref_grid->node;
  uVar5 = (ulong)(uint)pRVar2->max;
  if (pRVar2->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x394,
           "ref_metric_hessian_filter","malloc min_h of REF_DBL negative");
    RVar8 = 1;
  }
  else {
    local_b0 = ref_grid->mpi;
    scalar = (REF_DBL *)malloc(uVar5 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar9 = "malloc min_h of REF_DBL NULL";
      uVar7 = 0x394;
    }
    else {
      pRVar4 = (REF_DBL *)malloc(uVar5 * 0x30);
      if (pRVar4 == (REF_DBL *)0x0) {
        pcVar9 = "malloc hess_min_h of REF_DBL NULL";
        uVar7 = 0x395;
      }
      else {
        local_c8 = pRVar4;
        local_d0 = malloc(uVar5 * 8);
        if (local_d0 != (void *)0x0) {
          local_c0 = metric;
          for (lVar10 = 0; pRVar4 = local_c8, lVar10 < (int)uVar5; lVar10 = lVar10 + 1) {
            if (-1 < pRVar2->global[lVar10]) {
              uVar3 = ref_matrix_diag_m(metric,diag);
              if (uVar3 != 0) {
                uVar5 = (ulong)uVar3;
                pcVar9 = "decomp";
                uVar7 = 0x39a;
                goto LAB_001b6d17;
              }
              if (ref_grid->twod == 0) {
                uVar3 = ref_matrix_descending_eig(diag);
                if (uVar3 != 0) {
                  uVar5 = (ulong)uVar3;
                  pcVar9 = "3D ascend";
                  uVar7 = 0x39e;
                  goto LAB_001b6d17;
                }
              }
              else {
                uVar3 = ref_matrix_descending_eig_twod(diag);
                if (uVar3 != 0) {
                  uVar5 = (ulong)uVar3;
                  pcVar9 = "2D ascend";
                  uVar7 = 0x39c;
                  goto LAB_001b6d17;
                }
              }
              dVar12 = 0.0;
              if (0.0 <= diag[0]) {
                dVar12 = diag[0];
              }
              dVar11 = SQRT(dVar12) * 1e+20;
              if (dVar11 <= -dVar11) {
                dVar11 = -dVar11;
              }
              scalar[lVar10] =
                   (REF_DBL)(~-(ulong)(1.0 < dVar11) & 0x6974e718d7d7625a |
                            (ulong)(1.0 / SQRT(dVar12)) & -(ulong)(1.0 < dVar11));
              uVar5 = (ulong)(uint)pRVar2->max;
            }
            metric = metric + 6;
          }
          uVar3 = ref_recon_hessian(ref_grid,scalar,local_c8,REF_RECON_L2PROJECTION);
          if (uVar3 == 0) {
            max_threshold = 0.0;
            dVar12 = 0.0;
            for (lVar10 = 0; ref_mpi = local_b0, lVar10 < pRVar2->max; lVar10 = lVar10 + 1) {
              if (-1 < pRVar2->global[lVar10]) {
                local_b8 = dVar12;
                uVar3 = ref_matrix_diag_m(pRVar4,diag);
                if (uVar3 != 0) {
                  uVar5 = (ulong)uVar3;
                  pcVar9 = "decomp";
                  uVar7 = 0x3ae;
                  goto LAB_001b6d17;
                }
                if (ref_grid->twod == 0) {
                  uVar3 = ref_matrix_descending_eig(diag);
                  if (uVar3 != 0) {
                    uVar5 = (ulong)uVar3;
                    pcVar9 = "3D ascend";
                    uVar7 = 0x3b2;
                    goto LAB_001b6d17;
                  }
                }
                else {
                  uVar3 = ref_matrix_descending_eig_twod(diag);
                  if (uVar3 != 0) {
                    uVar5 = (ulong)uVar3;
                    pcVar9 = "2D ascend";
                    uVar7 = 0x3b0;
                    goto LAB_001b6d17;
                  }
                }
                __x = diag[0];
                if (diag[0] <= -diag[0]) {
                  __x = -diag[0];
                }
                dVar11 = log10(__x);
                *(double *)((long)local_d0 + lVar10 * 8) = dVar11;
                dVar12 = local_b8;
                max_threshold = local_b8;
                if (local_b8 <= dVar11) {
                  dVar12 = dVar11;
                  max_threshold = dVar11;
                }
              }
              pRVar4 = pRVar4 + 6;
            }
            temp = dVar12;
            uVar3 = ref_mpi_max(local_b0,&temp,&max_threshold,3);
            pRVar4 = local_c0;
            if (uVar3 == 0) {
              max_threshold = max_threshold * 0.5;
              uVar6 = 0;
              uVar5 = (ulong)(uint)pRVar2->max;
              if (pRVar2->max < 1) {
                uVar5 = uVar6;
              }
              auVar13 = ZEXT816(0);
              for (; local_a8 = auVar13._0_8_, uVar5 != uVar6; uVar6 = uVar6 + 1) {
                if ((-1 < pRVar2->global[uVar6]) &&
                   (pdVar1 = (double *)((long)local_d0 + uVar6 * 8),
                   *pdVar1 <= max_threshold && max_threshold != *pdVar1)) {
                  dVar11 = scalar[uVar6] * scalar[uVar6];
                  dVar12 = dVar11 * 1e+20;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  if ((1.0 < dVar12) && (dVar11 = 1.0 / dVar11, local_a8 <= dVar11)) {
                    auVar13._0_8_ = dVar11;
                  }
                }
              }
              temp = local_a8;
              uVar3 = ref_mpi_max(ref_mpi,&temp,&local_a8,3);
              if (uVar3 == 0) {
                lVar10 = 0;
                do {
                  if (pRVar2->max <= lVar10) {
                    free(local_d0);
                    free(local_c8);
                    free(scalar);
                    return 0;
                  }
                  if (-1 < pRVar2->global[lVar10]) {
                    uVar3 = ref_matrix_diag_m(pRVar4,diag);
                    if (uVar3 != 0) {
                      uVar5 = (ulong)uVar3;
                      pcVar9 = "decomp";
                      uVar7 = 0x3cd;
                      goto LAB_001b6d17;
                    }
                    if (ref_grid->twod == 0) {
                      uVar3 = ref_matrix_descending_eig(diag);
                      if (uVar3 != 0) {
                        uVar5 = (ulong)uVar3;
                        pcVar9 = "3D ascend";
                        uVar7 = 0x3d1;
                        goto LAB_001b6d17;
                      }
                    }
                    else {
                      uVar3 = ref_matrix_descending_eig_twod(diag);
                      if (uVar3 != 0) {
                        uVar5 = (ulong)uVar3;
                        pcVar9 = "2D ascend";
                        uVar7 = 0x3cf;
                        goto LAB_001b6d17;
                      }
                    }
                    auVar14._8_8_ = local_a8;
                    auVar14._0_8_ = local_a8;
                    diag._0_16_ = minpd(diag._0_16_,auVar14);
                    if ((ref_grid->twod == 0) && (local_a8 <= diag[2])) {
                      diag[2] = local_a8;
                    }
                    uVar3 = ref_matrix_form_m(diag,pRVar4);
                    if (uVar3 != 0) {
                      uVar5 = (ulong)uVar3;
                      pcVar9 = "reform";
                      uVar7 = 0x3d7;
                      goto LAB_001b6d17;
                    }
                  }
                  lVar10 = lVar10 + 1;
                  pRVar4 = pRVar4 + 6;
                } while( true );
              }
              uVar5 = (ulong)uVar3;
              pcVar9 = "max";
              uVar7 = 0x3c7;
            }
            else {
              uVar5 = (ulong)uVar3;
              pcVar9 = "max";
              uVar7 = 0x3b8;
            }
          }
          else {
            uVar5 = (ulong)uVar3;
            pcVar9 = "hess";
            uVar7 = 0x3a9;
          }
LAB_001b6d17:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 uVar7,"ref_metric_hessian_filter",uVar5,pcVar9);
          return (REF_STATUS)uVar5;
        }
        pcVar9 = "malloc threshold of REF_DBL NULL";
        uVar7 = 0x396;
        local_d0 = (void *)0x0;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar7,
           "ref_metric_hessian_filter",pcVar9);
    RVar8 = 2;
  }
  return RVar8;
}

Assistant:

REF_FCN REF_STATUS ref_metric_hessian_filter(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_DBL *min_h, *hess_min_h, *threshold;
  REF_DBL temp, max_threshold, max_valid, eig;
  REF_INT node;
  ref_malloc(min_h, ref_node_max(ref_node), REF_DBL);
  ref_malloc(hess_min_h, 6 * ref_node_max(ref_node), REF_DBL);
  ref_malloc(threshold, ref_node_max(ref_node), REF_DBL);

  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    min_h[node] = sqrt(MAX(0.0, ref_matrix_eig(diag, 0)));
    if (ref_math_divisible(1.0, min_h[node])) {
      min_h[node] = 1.0 / min_h[node];
    } else {
      min_h[node] = REF_DBL_MAX;
    }
  }

  RSS(ref_recon_hessian(ref_grid, min_h, hess_min_h, REF_RECON_L2PROJECTION),
      "hess");

  max_threshold = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(hess_min_h[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    threshold[node] = log10(ABS(ref_matrix_eig(diag, 0)));
    max_threshold = MAX(max_threshold, threshold[node]);
  }
  temp = max_threshold;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_threshold, REF_DBL_TYPE), "max");

  /* find the largest valid eigenvalue that is not in a discontinuity */
  max_threshold = 0.5 * max_threshold;
  max_valid = 0.0;
  each_ref_node_valid_node(ref_node, node) {
    if (threshold[node] < max_threshold) {
      REF_DBL h2 = min_h[node] * min_h[node];
      if (ref_math_divisible(1.0, h2)) {
        eig = 1.0 / h2;
        max_valid = MAX(max_valid, eig);
      }
    }
  }
  temp = max_valid;
  RSS(ref_mpi_max(ref_mpi, &temp, &max_valid, REF_DBL_TYPE), "max");

  /* limit hessian eigenvalues everwhere based on what is considered valid
   * outside a discontinuity */
  each_ref_node_valid_node(ref_node, node) {
    REF_DBL diag[12];
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag), "decomp");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_matrix_descending_eig_twod(diag), "2D ascend");
    } else {
      RSS(ref_matrix_descending_eig(diag), "3D ascend");
    }
    ref_matrix_eig(diag, 0) = MIN(ref_matrix_eig(diag, 0), max_valid);
    ref_matrix_eig(diag, 1) = MIN(ref_matrix_eig(diag, 1), max_valid);
    if (!ref_grid_twod(ref_grid))
      ref_matrix_eig(diag, 2) = MIN(ref_matrix_eig(diag, 2), max_valid);
    RSS(ref_matrix_form_m(diag, &(metric[6 * node])), "reform");
  }
  ref_free(threshold);
  ref_free(hess_min_h);
  ref_free(min_h);

  return REF_SUCCESS;
}